

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O1

void __thiscall
QNetworkReplyImplPrivate::setCachingEnabled(QNetworkReplyImplPrivate *this,bool enable)

{
  undefined8 uVar1;
  QAbstractNetworkCache *pQVar2;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000031,enable) == 0) {
    if (this->cacheEnabled == true) {
      if (enable) goto LAB_0019a88c;
LAB_0019a8e1:
      local_38[0] = '\x02';
      local_38[1] = '\0';
      local_38[2] = '\0';
      local_38[3] = '\0';
      local_38[4] = '\0';
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[7] = '\0';
      local_38[8] = '\0';
      local_38[9] = '\0';
      local_38[10] = '\0';
      local_38[0xb] = '\0';
      local_38[0xc] = '\0';
      local_38[0xd] = '\0';
      local_38[0xe] = '\0';
      local_38[0xf] = '\0';
      local_38[0x10] = '\0';
      local_38[0x11] = '\0';
      local_38[0x12] = '\0';
      local_38[0x13] = '\0';
      local_38[0x14] = '\0';
      local_38[0x15] = '\0';
      local_38[0x16] = '\0';
      local_38[0x17] = '\0';
      local_20 = "default";
      (*(code *)**(undefined8 **)this->backend)();
      uVar1 = QMetaObject::className();
      QMessageLogger::debug
                (local_38,
                 "QNetworkReplyImpl: setCachingEnabled(true) called after setCachingEnabled(false) -- backend %s probably needs to be fixed"
                 ,uVar1);
      pQVar2 = QNetworkAccessBackend::networkCache((QNetworkAccessBackend *)this->backend);
      (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&(this->super_QNetworkReplyPrivate).url);
      this->cacheSaveDevice = (QIODevice *)0x0;
      this->cacheEnabled = false;
    }
  }
  else {
LAB_0019a88c:
    if (this->cacheEnabled == false) {
      if (!enable) goto LAB_0019a8e1;
      if (this->bytesDownloaded == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          createCache(this);
          return;
        }
        goto LAB_0019a97b;
      }
      setCachingEnabled();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0019a97b:
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::setCachingEnabled(bool enable)
{
    if (!enable && !cacheEnabled)
        return;                 // nothing to do
    if (enable && cacheEnabled)
        return;                 // nothing to do either!

    if (enable) {
        if (Q_UNLIKELY(bytesDownloaded)) {
            // refuse to enable in this case
            qCritical("QNetworkReplyImpl: backend error: caching was enabled after some bytes had been written");
            return;
        }

        createCache();
    } else {
        // someone told us to turn on, then back off?
        // ok... but you should make up your mind
        qDebug("QNetworkReplyImpl: setCachingEnabled(true) called after setCachingEnabled(false) -- "
               "backend %s probably needs to be fixed",
               backend->metaObject()->className());
        networkCache()->remove(url);
        cacheSaveDevice = nullptr;
        cacheEnabled = false;
    }
}